

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O2

void export_results_to_string(double **results,uint total_experiments,char *result_to_string)

{
  size_t sVar1;
  ulong uVar2;
  char current_experiment_to_string [131072];
  
  memset(current_experiment_to_string,0,0x20000);
  strncpy(result_to_string,
          ",Time elapsed,omega,tau,h,V residual in C,V residual in L2,G residual in C,G residual in L2\n"
          ,0x20000);
  uVar2 = 0;
  while (total_experiments != uVar2) {
    snprintf(current_experiment_to_string,0x20000,
             "%d%c%.3lf s%c%.3lf%c%le%c%le%c%le%c%le%c%le%c%le\n",(*results)[uVar2],
             results[7][uVar2],results[5][uVar2],results[6][uVar2],results[1][uVar2],
             results[2][uVar2],results[3][uVar2],results[4][uVar2],uVar2 + 1 & 0xffffffff,0x2c,0x2c,
             0x2c,0x2c,0x2c,0x2c,0x2c,0x2c);
    sVar1 = strlen(result_to_string);
    strncat(result_to_string,current_experiment_to_string,0x1ffff - sVar1);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void export_results_to_string (double *const * results, unsigned total_experiments, char * result_to_string) {
  char current_experiment_to_string[MAX_BUFFER_SIZE] = "";
  const char delimiter = ',';
  unsigned experiments_step = 0;

  strncpy (result_to_string, 
    ",Time elapsed,omega,tau,h,V residual in C,V residual in L2,G residual in C,G residual in L2\n",
    MAX_BUFFER_SIZE);
  for (experiments_step = 0; experiments_step < total_experiments; ++experiments_step) {
    snprintf (
      current_experiment_to_string,
      MAX_BUFFER_SIZE,
      "%d%c"
      "%.3lf s%c"
      "%.3lf%c"
      "%le%c"
      "%le%c"
      "%le%c"
      "%le%c"
      "%le%c"
      "%le\n",
        experiments_step + 1,
        delimiter,
        results[0][experiments_step],
        delimiter,
        results[7][experiments_step],
        delimiter,
        results[5][experiments_step],
        delimiter,
        results[6][experiments_step],
        delimiter,
        results[1][experiments_step],
        delimiter,
        results[2][experiments_step],
        delimiter,
        results[3][experiments_step],
        delimiter,
        results[4][experiments_step]
    );
    // |^ looks ugly, should fix later
    strncat (result_to_string, current_experiment_to_string,
             MAX_BUFFER_SIZE - strlen(result_to_string) - 1);
  }
  return;
}